

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

string * __thiscall
Lodtalk::Class::getNameString_abi_cxx11_(string *__return_storage_ptr__,Class *this)

{
  bool bVar1;
  ByteSymbol *nameSymbol;
  allocator local_19;
  Class *local_18;
  Class *this_local;
  
  local_18 = this;
  this_local = (Class *)__return_storage_ptr__;
  if ((this->name).field_0.pointer == (uint8_t *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"uninitialized",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    bVar1 = Oop::isNil(&this->name);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"UnknownClass",
                 (allocator *)((long)&nameSymbol + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&nameSymbol + 3));
    }
    else {
      ByteSymbol::getString_abi_cxx11_
                (__return_storage_ptr__,(ByteSymbol *)(this->name).field_0.header);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Class::getNameString()
{
	if(!name.pointer)
		return "uninitialized";
	if(name.isNil())
		return "UnknownClass";

	ByteSymbol *nameSymbol = reinterpret_cast<ByteSymbol *> (name.pointer);
	return nameSymbol->getString();
}